

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_parser.h
# Opt level: O2

LengthMod __thiscall absl::lts_20250127::str_format_internal::ConvTag::as_length(ConvTag *this)

{
  uint __line;
  char *__assertion;
  
  if ((char)this->tag_ < '\0') {
    __assertion = "is_length()";
    __line = 0x6a;
  }
  else {
    __assertion = "!is_conv()";
    __line = 0x69;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                ,__line,"LengthMod absl::str_format_internal::ConvTag::as_length() const");
}

Assistant:

constexpr LengthMod as_length() const {
    assert(!is_conv());
    assert(is_length());
    assert(!is_flags());
    return static_cast<LengthMod>(tag_ & 0x3F);
  }